

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit.hpp
# Opt level: O2

void __thiscall boost::unit_test::test_suite::~test_suite(test_suite *this)

{
  this->_vptr_test_suite = (_func_int **)&PTR__test_suite_001e00c0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_ranked_children)._M_t);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  test_unit::~test_unit(&this->super_test_unit);
  return;
}

Assistant:

virtual         ~test_suite() {}